

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem.c
# Opt level: O1

void coda_mem_done(void)

{
  coda_dynamic_type *pcVar1;
  long lVar2;
  long in_FS_OFFSET;
  
  lVar2 = 0;
  do {
    pcVar1 = *(coda_dynamic_type **)(in_FS_OFFSET + lVar2 * 8 + -0xc0);
    if (pcVar1 != (coda_dynamic_type *)0x0) {
      coda_mem_type_delete(pcVar1);
    }
    *(undefined8 *)(in_FS_OFFSET + lVar2 * 8 + -0xc0) = 0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xb);
  lVar2 = 0;
  do {
    pcVar1 = *(coda_dynamic_type **)(in_FS_OFFSET + lVar2 * 8 + -0x60);
    if (pcVar1 != (coda_dynamic_type *)0x0) {
      coda_mem_type_delete(pcVar1);
    }
    *(undefined8 *)(in_FS_OFFSET + lVar2 * 8 + -0x60) = 0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xb);
  return;
}

Assistant:

void coda_mem_done(void)
{
    int i;

    for (i = 0; i < num_empty_record_singletons; i++)
    {
        if (empty_record_singleton[i] != NULL)
        {
            coda_mem_type_delete((coda_dynamic_type *)empty_record_singleton[i]);
        }
        empty_record_singleton[i] = NULL;
    }
    for (i = 0; i < num_no_data_singletons; i++)
    {
        if (no_data_singleton[i] != NULL)
        {
            coda_mem_type_delete((coda_dynamic_type *)no_data_singleton[i]);
        }
        no_data_singleton[i] = NULL;
    }
}